

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineContinuity
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  ostringstream *this_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  deUint8 dVar6;
  int iVar7;
  long lVar8;
  int y;
  int iVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int z;
  uint uVar14;
  bool bVar15;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [384];
  
  iVar2 = begin->m_data[0];
  z = begin->m_data[1];
  iVar3 = end->m_data[0];
  bVar15 = iVar2 == iVar3;
  lVar8 = (long)componentNdx;
  iVar7 = 0;
  iVar12 = 0;
  bVar5 = 0;
  y = iVar2;
  do {
    bVar4 = true;
    lVar13 = 0;
    iVar9 = y;
    do {
      iVar11 = iVar9;
      piVar1 = end->m_data + lVar13;
      if (!bVar4) break;
      lVar13 = 1;
      bVar4 = false;
      iVar9 = z;
    } while (iVar11 == *piVar1);
    if (iVar11 == *piVar1) {
      if ((iVar7 < 1) ||
         (*messageLimitCounter = *messageLimitCounter + -1, *messageLimitCounter < 0)) {
        dVar6 = '\0';
      }
      else {
        local_1b0._0_8_ =
             ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Found non-continuous ",0x15);
        pcVar10 = "horizontal";
        if (iVar2 == iVar3) {
          pcVar10 = "vertical";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,pcVar10,(ulong)(iVar2 != iVar3) * 2 + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," line near ",0xb);
        tcu::operator<<((ostream *)this_00,begin);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Missed pixels: ",0xf)
        ;
        std::ostream::operator<<(this_00,iVar7);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        dVar6 = (iVar7 <= (int)((float)iVar12 * 0.1 +
                               *(float *)(&DAT_009a6438 + (ulong)((float)iVar12 * 0.1 < 0.0) * 4)))
                * ' ' + ' ';
      }
      return dVar6;
    }
    iVar9 = (int)access;
    tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)local_1b0,iVar9,y,z);
    uVar14 = (uint)!bVar15;
    if ((bool)(~bVar5 & 1) || *(int *)(local_1b0 + lVar8 * 4) != 0) {
      bVar5 = bVar5 | *(int *)(local_1b0 + lVar8 * 4) != 0;
    }
    else {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_1b0,iVar9,(uint)bVar15 + y,z + (uint)!bVar15);
      if (*(int *)(local_1b0 + lVar8 * 4) == 0) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_1c0,iVar9,y - (uint)bVar15,z - uVar14);
        iVar7 = iVar7 + (uint)(*(int *)(local_1c0 + lVar8 * 4) == 0);
      }
    }
    iVar12 = iVar12 + 1;
    y = y + uVar14;
    z = z + (uint)bVar15;
  } while( true );
}

Assistant:

deUint8 LineRenderCase::checkLineContinuity (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	bool				line					= false;
	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	int					missedPixels			= 0;
	int					totalPixels				= 0;
	deUint8				errorMask				= 0;

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			line = true;
		else if (line && !hit)
		{
			// non-continuous line detected
			const tcu::IVec2 advanceNeighbor	= tcu::IVec2(1, 1) - advance;
			const tcu::IVec2 cursorNeighborPos	= cursor + advanceNeighbor;
			const tcu::IVec2 cursorNeighborNeg	= cursor - advanceNeighbor;
			// hw precision issues may lead to a line being non-straight -> check neighboring pixels
			if ((access.getPixelInt(cursorNeighborPos.x(), cursorNeighborPos.y())[componentNdx] == 0) && (access.getPixelInt(cursorNeighborNeg.x(), cursorNeighborNeg.y())[componentNdx] == 0))
				++missedPixels;
		}
		++totalPixels;
	}

	if (missedPixels > 0 && --messageLimitCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Found non-continuous " << ((advance.x() == 1)  ? ("horizontal") : ("vertical")) << " line near " << begin << ". "
			<< "Missed pixels: " << missedPixels
			<< tcu::TestLog::EndMessage;
		// allow 10% missing pixels for warning
		if (missedPixels <= deRoundFloatToInt32((float)totalPixels * 0.1f))
			errorMask = SCANRESULT_LINE_CONT_WARN_BIT;
		else
			errorMask =  SCANRESULT_LINE_CONT_ERR_BIT;
	}

	return errorMask;
}